

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

void __thiscall Player::Attack(Player *this,Player *target,string *prov)

{
  int ap;
  int dp;
  Type TVar1;
  int iVar2;
  Personality *this_00;
  ostream *poVar3;
  DynastyDeck *this_01;
  char *pcVar4;
  DynastyDeck *this_02;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)prov);
  this_00 = (Personality *)DynastyDeck::findTarget(&target->provinces,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (this_00 == (Personality *)0x0) {
    pcVar4 = "Invalid target province";
  }
  else {
    this_01 = &this->army;
    ap = DynastyDeck::calculateAttackPoints(this_01);
    this_02 = &target->army;
    dp = DynastyDeck::calculateDefensePoints(this_02);
    TVar1 = Card::getType((Card *)this_00);
    if (TVar1 == PERSONALITY) {
      iVar2 = Personality::getDefense(this_00);
      dp = dp + iVar2;
    }
    if (dp < ap) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Attack successful");
      std::endl<char,std::char_traits<char>>(poVar3);
      DynastyDeck::popCard(&target->provinces,(BlackCard *)this_00);
      Card::getType((Card *)this_00);
      (*(this_00->super_BlackCard).super_Card._vptr_Card[3])(this_00);
      DynastyDeck::BattleConsequences(this_02,false,false,ap,dp);
      DynastyDeck::BattleConsequences(this_01,true,true,ap,dp);
      (*(this_00->super_BlackCard).super_Card._vptr_Card[3])(this_00);
      pcVar4 = "Province destroyed";
    }
    else if (ap == dp) {
      DynastyDeck::BattleConsequences(this_02,false,false,ap,ap);
      DynastyDeck::BattleConsequences(this_01,true,false,ap,ap);
      pcVar4 = "Draw";
    }
    else {
      DynastyDeck::BattleConsequences(this_02,false,true,ap,dp);
      DynastyDeck::BattleConsequences(this_01,true,false,ap,dp);
      pcVar4 = "Attack unsuccessful";
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void Player::Attack(Player * target, string prov)
{
    list<BlackCard*>::iterator it;

    Personality * pers;
    Item * item;

    BlackCard *prTarget = target->provinces.findTarget(prov);
    if (!prTarget)
    {
        cout << "Invalid target province"<<endl;
        return;
    }

    int ap = army.calculateAttackPoints();
    int dp = target->army.calculateDefensePoints();        //without provinces initial defense

    if (prTarget->getType() == Card::PERSONALITY) //all followers and items associated with personalities are deleted by their constructor
    {
        pers = reinterpret_cast<Personality *>(prTarget);
        dp += pers->getDefense();
    }

    if (ap > dp)
    {
        cout << "Attack successful"<<endl;

        //destroy province of target
        target->provinces.popCard(prTarget);

        if (prTarget->getType() == Card::PERSONALITY)
            delete pers;
        else
            delete item;

        target->army.BattleConsequences(false, false, ap, dp);                   //destroy associated army of target
        this->army.BattleConsequences(true, true, ap, dp);                       //change attacking army

        delete prTarget;
        cout << "Province destroyed"<<endl;
    }
    else if (ap == dp)
    {
        //destroy all attacking and defending armies
        target->army.BattleConsequences(false, false, ap, dp);
        this->army.BattleConsequences(true, false, ap, dp);
        cout << "Draw"<<endl;
    }
    else
    {
        target->army.BattleConsequences(false, true, ap, dp);                   //change associated army of target
        this->army.BattleConsequences(true, false, ap, dp);                     //destroy attacking army
        cout << "Attack unsuccessful"<<endl;
    }
}